

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O2

void Hacl_GenericField32_exp_consttime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  uint32_t *puVar5;
  uint32_t *__n_00;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint32_t *os;
  uint uVar12;
  uint32_t *os_15;
  uint32_t *puVar13;
  ulong uVar14;
  uint32_t *puVar15;
  uint32_t *puVar16;
  ulong uVar17;
  uint32_t *puVar18;
  uint32_t auStack_100 [4];
  uint32_t *local_f0;
  uint32_t *local_e8;
  uint32_t *local_e0;
  uint32_t *local_d8;
  uint32_t *local_d0;
  uint32_t *local_c8;
  uint32_t *local_c0;
  uint32_t *local_b8;
  uint32_t *local_b0;
  uint32_t *local_a8;
  uint32_t *local_a0;
  ulong local_98;
  uint32_t *local_90;
  uint32_t *local_88;
  uint32_t *local_80;
  uint32_t local_74;
  uint32_t *local_70;
  uint32_t *local_68;
  undefined8 local_60;
  uint32_t *ctx_r2;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *ctx_n;
  uint32_t local_34;
  
  uVar10 = (ulong)bBits;
  uVar1 = k->len;
  uVar17 = (ulong)uVar1;
  local_50 = k->n;
  local_34 = k->mu;
  ctx_r2 = k->r2;
  uVar14 = uVar17 * 4 + 0xf & 0xfffffffffffffff0;
  lVar4 = -uVar14;
  puVar13 = (uint32_t *)((long)auStack_100 + lVar4 + 8);
  local_b8 = b;
  ctx_n = (uint32_t *)(uVar17 * 4);
  *(undefined8 *)((long)auStack_100 + lVar4) = 0x138a29;
  memcpy(puVar13,aM,(size_t)(uVar17 * 4));
  local_98 = uVar10;
  if (bBits < 200) {
    puVar15 = (uint32_t *)((long)puVar13 - ((ulong)(uVar1 * 2) * 4 + 0xf & 0xfffffffffffffff0));
    puVar15[-2] = 0x138a64;
    puVar15[-1] = 0;
    memset(puVar15,0,(ulong)(uVar1 * 2) << 2);
    puVar5 = ctx_n;
    puVar11 = local_50;
    puVar15[-2] = 0x138a74;
    puVar15[-1] = 0;
    memcpy(puVar15,puVar11,(size_t)puVar5);
    puVar5 = ctx_n;
    puVar11 = ctx_r2;
    local_48 = puVar15 + uVar17;
    puVar15[-2] = 0x138a90;
    puVar15[-1] = 0;
    memcpy(puVar15 + uVar17,puVar11,(size_t)puVar5);
    uVar7 = local_34;
    puVar11 = local_48;
    ctx_n = puVar15;
    puVar15[-2] = 0x138aa9;
    puVar15[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar1,puVar15,uVar7,puVar11,resM);
    uVar7 = local_34;
    ctx_r2 = (uint32_t *)0x0;
    uVar6 = 0;
    while( true ) {
      if ((uint)ctx_r2 == (uint)uVar10) break;
      uVar9 = ~(uint)ctx_r2 + (uint)uVar10;
      uVar9 = (uint)((local_b8[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0);
      local_48 = (uint32_t *)CONCAT44(local_48._4_4_,uVar9);
      for (uVar10 = 0; puVar11 = ctx_n, uVar17 != uVar10; uVar10 = uVar10 + 1) {
        uVar2 = puVar13[uVar10];
        uVar12 = (uVar2 ^ resM[uVar10]) & -(uVar6 ^ uVar9);
        resM[uVar10] = resM[uVar10] ^ uVar12;
        puVar13[uVar10] = uVar12 ^ uVar2;
      }
      puVar15[-2] = 0x138b24;
      puVar15[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar11,uVar7,puVar13,resM,puVar13);
      puVar15[-2] = 0x138b3b;
      puVar15[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar11,uVar7,resM,resM);
      ctx_r2 = (uint32_t *)(ulong)((int)ctx_r2 + 1);
      uVar10 = local_98;
      uVar6 = (uint)local_48;
    }
    for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
      uVar1 = puVar13[uVar10];
      uVar9 = (uVar1 ^ resM[uVar10]) & -uVar6;
      resM[uVar10] = resM[uVar10] ^ uVar9;
      puVar13[uVar10] = uVar9 ^ uVar1;
    }
  }
  else {
    local_74 = (bBits - 1 >> 5) + 1;
    local_68 = (uint32_t *)(ulong)(uVar1 * 2);
    puVar16 = (uint32_t *)((long)puVar13 - ((long)local_68 * 4 + 0xfU & 0xfffffffffffffff0));
    __n = (long)local_68 * 4;
    local_70 = (uint32_t *)uVar14;
    local_48 = puVar16;
    puVar16[-2] = 0x138b93;
    puVar16[-1] = 0;
    memset(puVar16,0,__n);
    puVar5 = ctx_n;
    puVar11 = local_50;
    puVar16[-2] = 0x138ba3;
    puVar16[-1] = 0;
    memcpy(puVar16,puVar11,(size_t)puVar5);
    puVar5 = ctx_n;
    puVar11 = ctx_r2;
    local_60 = puVar16 + uVar17;
    puVar16[-2] = 0x138bbf;
    puVar16[-1] = 0;
    memcpy(puVar16 + uVar17,puVar11,(size_t)puVar5);
    puVar16 = puVar16 + -(ulong)(uVar1 << 4);
    local_50 = puVar16;
    puVar16[-2] = 0x138be0;
    puVar16[-1] = 0;
    memset(puVar16,0,(ulong)(uVar1 << 4) * 4);
    puVar11 = ctx_n;
    puVar18 = (uint32_t *)((long)puVar16 - (long)local_70);
    puVar18[-2] = 0x138bf8;
    puVar18[-1] = 0;
    memset(puVar18,0,(size_t)puVar11);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_60;
    local_90 = puVar16 + uVar17;
    puVar18[-2] = 0x138c20;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar1,puVar5,uVar7,puVar11,puVar16);
    puVar5 = ctx_n;
    puVar11 = local_90;
    puVar18[-2] = 0x138c33;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar13,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_90;
    puVar18[-2] = 0x138c4c;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar15 = ctx_n;
    puVar16 = puVar16 + (long)local_68;
    local_68 = puVar16;
    puVar18[-2] = 0x138c6e;
    puVar18[-1] = 0;
    memcpy(puVar16,puVar18,(size_t)puVar15);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_68;
    puVar18[-2] = 0x138c87;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar5,uVar7,puVar13,puVar11,puVar18);
    puVar11 = local_50 + uVar1 * 3;
    local_b0 = puVar11;
    puVar18[-2] = 0x138ca5;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar15);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_68;
    puVar18[-2] = 0x138cbe;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar15 = ctx_n;
    puVar11 = local_50 + uVar1 * 4;
    local_88 = puVar11;
    puVar18[-2] = 0x138cde;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar15);
    uVar7 = local_34;
    puVar11 = local_88;
    puVar18[-2] = 0x138cfa;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar5,uVar7,puVar13,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 5;
    local_a8 = puVar11;
    puVar18[-2] = 0x138d19;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    puVar5 = local_48;
    puVar11 = local_b0;
    puVar18[-2] = 0x138d32;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar11 = ctx_n;
    puVar5 = local_50;
    puVar15 = local_50 + uVar1 * 6;
    local_80 = puVar15;
    puVar18[-2] = 0x138d55;
    puVar18[-1] = 0;
    memcpy(puVar15,puVar18,(size_t)puVar11);
    uVar7 = local_34;
    puVar15 = local_48;
    puVar11 = local_80;
    puVar18[-2] = 0x138d6e;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar15,uVar7,puVar13,puVar11,puVar18);
    puVar11 = ctx_n;
    local_a0 = puVar5 + uVar1 * 7;
    puVar18[-2] = 0x138d90;
    puVar18[-1] = 0;
    memcpy(puVar5 + uVar1 * 7,puVar18,(size_t)puVar11);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_88;
    puVar18[-2] = 0x138da6;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 8;
    puVar18[-2] = 0x138dc5;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    local_f0 = puVar11;
    puVar18[-2] = 0x138de4;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar5,uVar7,puVar13,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 9;
    local_e8 = puVar11;
    puVar18[-2] = 0x138e03;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_a8;
    puVar18[-2] = 0x138e1c;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 10;
    puVar18[-2] = 0x138e37;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    local_e0 = puVar11;
    puVar18[-2] = 0x138e56;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar5,uVar7,puVar13,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 0xb;
    local_d8 = puVar11;
    puVar18[-2] = 0x138e75;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_80;
    puVar18[-2] = 0x138e8b;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 0xc;
    puVar18[-2] = 0x138ea6;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    local_d0 = puVar11;
    puVar18[-2] = 0x138ec5;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar5,uVar7,puVar13,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 0xd;
    local_c8 = puVar11;
    puVar18[-2] = 0x138ee4;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    puVar11 = local_a0;
    puVar18[-2] = 0x138efd;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar5,uVar7,puVar11,puVar18);
    puVar5 = ctx_n;
    puVar11 = local_50 + uVar1 * 0xe;
    puVar18[-2] = 0x138f18;
    puVar18[-1] = 0;
    memcpy(puVar11,puVar18,(size_t)puVar5);
    uVar7 = local_34;
    puVar5 = local_48;
    local_c0 = puVar11;
    puVar18[-2] = 0x138f37;
    puVar18[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar5,uVar7,puVar13,puVar11,puVar18);
    __n_00 = ctx_n;
    puVar15 = local_50;
    uVar10 = local_98;
    puVar13 = local_50 + uVar1 * 0xf;
    puVar18[-2] = 0x138f5c;
    puVar18[-1] = 0;
    memcpy(puVar13,puVar18,(size_t)__n_00);
    uVar8 = local_34;
    puVar16 = local_48;
    puVar5 = local_60;
    uVar7 = local_74;
    puVar11 = local_b8;
    uVar6 = (uint)uVar10;
    if ((uVar10 & 3) == 0) {
      puVar18[-2] = 0x1392b8;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar1,puVar16,uVar8,puVar5,resM);
      uVar9 = uVar6;
    }
    else {
      local_60 = (uint32_t *)(CONCAT44(local_60._4_4_,uVar6) & 0xfffffffffffffffc);
      puVar18[-2] = 0x138f82;
      puVar18[-1] = 0;
      uVar7 = Hacl_Bignum_Lib_bn_get_bits_u32(uVar7,puVar11,uVar6 & 0xfffffffc,(uint32_t)puVar15);
      puVar11 = local_50;
      puVar18[-2] = 0x138f94;
      puVar18[-1] = 0;
      memcpy(resM,puVar11,(size_t)__n_00);
      puVar18[-2] = 1;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x138f9f;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_90[uVar10] & uVar8;
      }
      puVar18[-2] = 2;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x138ffb;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_68[uVar10] & uVar8;
      }
      puVar18[-2] = 3;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13902a;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_b0[uVar10] & uVar8;
      }
      puVar18[-2] = 4;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13905c;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_88[uVar10] & uVar8;
      }
      puVar18[-2] = 5;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13908b;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_a8[uVar10] & uVar8;
      }
      puVar18[-2] = 6;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1390bd;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_80[uVar10] & uVar8;
      }
      puVar18[-2] = 7;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1390ec;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_a0[uVar10] & uVar8;
      }
      puVar18[-2] = 8;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13911e;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_f0[uVar10] & uVar8;
      }
      puVar18[-2] = 9;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139150;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_e8[uVar10] & uVar8;
      }
      puVar18[-2] = 10;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139182;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_e0[uVar10] & uVar8;
      }
      puVar18[-2] = 0xb;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1391b4;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_d8[uVar10] & uVar8;
      }
      puVar18[-2] = 0xc;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1391e6;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_d0[uVar10] & uVar8;
      }
      puVar18[-2] = 0xd;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139218;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_c8[uVar10] & uVar8;
      }
      puVar18[-2] = 0xe;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13924a;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar8 | local_c0[uVar10] & uVar8;
      }
      puVar18[-2] = 0xf;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13927c;
      puVar18[-1] = 0;
      uVar7 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        resM[uVar10] = resM[uVar10] & ~uVar7 | puVar13[uVar10] & uVar7;
      }
      uVar9 = (uint)local_60;
    }
    puVar11 = ctx_n;
    puVar18 = (uint32_t *)((long)puVar18 - (long)local_70);
    local_70 = puVar13;
    puVar18[-2] = 0x1392da;
    puVar18[-1] = 0;
    memset(puVar18,0,(size_t)puVar11);
    ctx_r2 = (uint32_t *)0x0;
    uVar10 = (ulong)(uVar6 >> 2);
    local_60 = (uint32_t *)CONCAT44(local_60._4_4_,uVar9 - 4);
    local_98 = uVar10;
    while( true ) {
      uVar7 = local_34;
      puVar13 = local_48;
      if ((int)ctx_r2 == (int)uVar10) break;
      puVar18[-2] = 0x139319;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar13,uVar7,resM,resM);
      puVar18[-2] = 0x13932d;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar13,uVar7,resM,resM);
      puVar18[-2] = 0x139341;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar13,uVar7,resM,resM);
      puVar18[-2] = 0x139355;
      puVar18[-1] = 0;
      puVar11 = resM;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar1,puVar13,uVar7,resM,resM);
      uVar7 = local_74;
      puVar13 = local_b8;
      uVar8 = (uint)local_60 + (int)ctx_r2 * -4;
      puVar18[-2] = 0x139374;
      puVar18[-1] = 0;
      uVar7 = Hacl_Bignum_Lib_bn_get_bits_u32(uVar7,puVar13,uVar8,(uint32_t)puVar11);
      puVar11 = ctx_n;
      puVar13 = local_50;
      puVar18[-2] = 0x139387;
      puVar18[-1] = 0;
      memcpy(puVar18,puVar13,(size_t)puVar11);
      puVar18[-2] = 1;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139392;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_88;
      puVar13 = local_90;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 2;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1393ca;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar13 = local_68;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 3;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1393fb;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar13 = local_b0;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 4;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13942f;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 5;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13945d;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_a8;
      puVar13 = local_e8;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 6;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139498;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_80;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 7;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1394c9;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_a0;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 8;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1394fd;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_f0;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 9;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139531;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 10;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13955f;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_d8;
      puVar13 = local_e0;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 0xb;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x13959a;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 0xc;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x1395c8;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_c8;
      puVar13 = local_d0;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 0xd;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139603;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar11[uVar10] & uVar8;
      }
      puVar18[-2] = 0xe;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139631;
      puVar18[-1] = 0;
      uVar8 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      puVar11 = local_70;
      puVar13 = local_c0;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        puVar18[uVar10] = puVar18[uVar10] & ~uVar8 | puVar13[uVar10] & uVar8;
      }
      puVar18[-2] = 0xf;
      puVar18[-1] = 0;
      uVar3 = *(undefined8 *)(puVar18 + -2);
      puVar18[-2] = 0x139669;
      puVar18[-1] = 0;
      uVar7 = FStar_UInt32_eq_mask(uVar7,(uint32_t)uVar3);
      uVar10 = local_98;
      for (uVar14 = 0; uVar8 = local_34, puVar13 = local_48, uVar17 != uVar14; uVar14 = uVar14 + 1)
      {
        puVar18[uVar14] = puVar18[uVar14] & ~uVar7 | puVar11[uVar14] & uVar7;
      }
      puVar18[-2] = 0x1396ab;
      puVar18[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar1,puVar13,uVar8,resM,puVar18,resM);
      ctx_r2 = (uint32_t *)(ulong)((int)ctx_r2 + 1);
    }
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_consttime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len1; i++)
      {
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aMc[i]);
        resM[i] = resM[i] ^ dummy;
        aMc[i] = aMc[i] ^ dummy;
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, aMc, resM, aMc);
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    for (uint32_t i = 0U; i < len1; i++)
    {
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aMc[i]);
      resM[i] = resM[i] ^ dummy;
      aMc[i] = aMc[i] ^ dummy;
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i0 = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
      memcpy(resM, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = resM;
          uint32_t x = (c & res_j[i]) | (~c & resM[i]);
          os[i] = x;
        });
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
    {
      KRML_MAYBE_FOR4(i,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i0 - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      memcpy(tmp0, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = tmp0;
          uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
          os[i] = x;
        });
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}